

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocs_test.cc
# Opt level: O2

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  OcsCreateInstanceRequestType *this;
  HttpTestListener *this_00;
  undefined8 extraout_RAX;
  allocator<char> local_3b9;
  string local_3b8;
  string local_398 [32];
  string local_378 [32];
  string local_358;
  OcsActivateInstanceResponseType resp;
  OcsActivateInstanceRequestType req;
  char local_278 [8];
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  char local_258 [8];
  _Alloc_hider local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  char local_238 [8];
  size_type local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Alloc_hider local_218;
  _Alloc_hider local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  char local_1f8 [8];
  _Alloc_hider local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  char local_1d8 [8];
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  OcsCreateInstanceResponseType resp_2;
  
  paVar1 = &req.owner_id.field_2;
  req.owner_id._M_string_length = 0;
  req.owner_id.field_2._M_local_buf[0] = '\0';
  paVar2 = &req.resource_owner_account.field_2;
  req.resource_owner_account._M_string_length = 0;
  req.resource_owner_account.field_2._M_local_buf[0] = '\0';
  paVar3 = &req.resource_owner_id.field_2;
  req.resource_owner_id._M_string_length = 0;
  req.resource_owner_id.field_2._M_local_buf[0] = '\0';
  paVar4 = &req.owner_account.field_2;
  req.owner_account._M_string_length = 0;
  req.owner_account.field_2._M_local_buf[0] = '\0';
  paVar5 = &req.instance_id.field_2;
  req.instance_id._M_string_length = 0;
  req.instance_id.field_2._M_local_buf[0] = '\0';
  req.owner_id._M_dataplus._M_p = (pointer)paVar1;
  req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
  req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
  req.owner_account._M_dataplus._M_p = (pointer)paVar4;
  req.instance_id._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&resp_2,"cn-hangzhou",(allocator<char> *)&local_358);
  std::__cxx11::string::string<std::allocator<char>>
            (local_378,"my_appid",(allocator<char> *)&local_3b8);
  std::__cxx11::string::string<std::allocator<char>>(local_398,"my_secret",&local_3b9);
  this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient(&resp_2,local_378,local_398);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string((string *)&resp_2);
  if (this == (OcsCreateInstanceRequestType *)0x0) {
    aliyun::OcsActivateInstanceRequestType::~OcsActivateInstanceRequestType(&req);
    req.owner_id._M_string_length = 0;
    req.owner_id.field_2._M_local_buf[0] = '\0';
    req.resource_owner_account._M_string_length = 0;
    req.resource_owner_account.field_2._M_local_buf[0] = '\0';
    req.resource_owner_id._M_string_length = 0;
    req.resource_owner_id.field_2._M_local_buf[0] = '\0';
    req.owner_account._M_string_length = 0;
    req.owner_account.field_2._M_local_buf[0] = '\0';
    req.instance_id._M_string_length = 0;
    req.instance_id.field_2._M_local_buf[0] = '\0';
    local_278 = (char  [8])&local_268;
    local_270._M_p = (pointer)0x0;
    local_268._M_local_buf[0] = '\0';
    req.owner_id._M_dataplus._M_p = (pointer)paVar1;
    req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
    req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
    req.owner_account._M_dataplus._M_p = (pointer)paVar4;
    req.instance_id._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resp_2,"cn-hangzhou",(allocator<char> *)&local_358);
    std::__cxx11::string::string<std::allocator<char>>
              (local_378,"my_appid",(allocator<char> *)&local_3b8);
    std::__cxx11::string::string<std::allocator<char>>(local_398,"my_secret",&local_3b9);
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient(&resp_2,local_378,local_398)
    ;
    std::__cxx11::string::~string(local_398);
    std::__cxx11::string::~string(local_378);
    std::__cxx11::string::~string((string *)&resp_2);
    if (this == (OcsCreateInstanceRequestType *)0x0) {
      aliyun::OcsAddAuthenticIPRequestType::~OcsAddAuthenticIPRequestType
                ((OcsAddAuthenticIPRequestType *)&req);
      req.owner_id._M_string_length = 0;
      req.owner_id.field_2._M_local_buf[0] = '\0';
      req.resource_owner_account._M_string_length = 0;
      req.resource_owner_account.field_2._M_local_buf[0] = '\0';
      req.resource_owner_id._M_string_length = 0;
      req.resource_owner_id.field_2._M_local_buf[0] = '\0';
      req.owner_account._M_string_length = 0;
      req.owner_account.field_2._M_local_buf[0] = '\0';
      req.instance_id._M_string_length = 0;
      req.instance_id.field_2._M_local_buf[0] = '\0';
      local_278 = (char  [8])&local_268;
      local_270._M_p = (pointer)0x0;
      local_268._M_local_buf[0] = '\0';
      local_258 = (char  [8])&local_248;
      local_250._M_p = (pointer)0x0;
      local_248._M_local_buf[0] = '\0';
      local_238 = (char  [8])&local_228;
      local_230 = 0;
      local_228._M_local_buf[0] = '\0';
      local_218._M_p = (pointer)&local_208;
      local_210._M_p = (pointer)0x0;
      local_208._M_local_buf[0] = '\0';
      local_1f8 = (char  [8])&local_1e8;
      local_1f0._M_p = (pointer)0x0;
      local_1e8._M_local_buf[0] = '\0';
      local_1d8 = (char  [8])&local_1c8;
      local_1d0 = 0;
      local_1c8._M_local_buf[0] = '\0';
      local_1b8._M_p = (pointer)&local_1a8;
      local_1b0 = 0;
      local_1a8._M_local_buf[0] = '\0';
      local_198._M_p = (pointer)&local_188;
      local_190 = 0;
      resp_2.instance_id._M_dataplus._M_p = (pointer)&resp_2.instance_id.field_2;
      resp_2.instance_id._M_string_length = 0;
      resp_2.instance_id.field_2._M_allocated_capacity =
           resp_2.instance_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
      resp_2.instance_name._M_dataplus._M_p = (pointer)&resp_2.instance_name.field_2;
      resp_2.instance_name._M_string_length = 0;
      resp_2.instance_name.field_2._M_local_buf[0] = '\0';
      resp_2.connection_domain._M_dataplus._M_p = (pointer)&resp_2.connection_domain.field_2;
      resp_2.connection_domain._M_string_length = 0;
      resp_2.connection_domain.field_2._M_local_buf[0] = '\0';
      resp_2.user_name._M_dataplus._M_p = (pointer)&resp_2.user_name.field_2;
      resp_2.user_name._M_string_length = 0;
      resp_2.user_name.field_2._M_local_buf[0] = '\0';
      resp_2.instance_status._M_dataplus._M_p = (pointer)&resp_2.instance_status.field_2;
      resp_2.instance_status._M_string_length = 0;
      resp_2.instance_status.field_2._M_local_buf[0] = '\0';
      resp_2.region_id._M_dataplus._M_p = (pointer)&resp_2.region_id.field_2;
      resp_2.region_id._M_string_length = 0;
      resp_2.region_id.field_2._M_local_buf[0] = '\0';
      resp_2.zone_id._M_dataplus._M_p = (pointer)&resp_2.zone_id.field_2;
      resp_2.zone_id._M_string_length = 0;
      resp_2.zone_id.field_2._M_local_buf[0] = '\0';
      resp_2.network_type._M_dataplus._M_p = (pointer)&resp_2.network_type.field_2;
      resp_2.network_type._M_string_length = 0;
      local_188._M_local_buf[0] = '\0';
      resp_2.network_type.field_2._M_local_buf[0] = '\0';
      resp_2.private_ip_address._M_dataplus._M_p = (pointer)&resp_2.private_ip_address.field_2;
      resp_2.private_ip_address._M_string_length = 0;
      resp_2.private_ip_address.field_2._M_local_buf[0] = '\0';
      req.owner_id._M_dataplus._M_p = (pointer)paVar1;
      req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
      req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
      req.owner_account._M_dataplus._M_p = (pointer)paVar4;
      req.instance_id._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::string<std::allocator<char>>
                (local_378,"cn-hangzhou",(allocator<char> *)&local_3b8);
      std::__cxx11::string::string<std::allocator<char>>
                (local_398,"my_appid",(allocator<char> *)&resp);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,"my_secret",&local_3b9);
      this = (OcsCreateInstanceRequestType *)
             aliyun::Ocs::CreateOcsClient(local_378,local_398,&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string(local_398);
      std::__cxx11::string::~string(local_378);
      if (this == (OcsCreateInstanceRequestType *)0x0) {
        aliyun::OcsCreateInstanceResponseType::~OcsCreateInstanceResponseType(&resp_2);
        aliyun::OcsCreateInstanceRequestType::~OcsCreateInstanceRequestType
                  ((OcsCreateInstanceRequestType *)&req);
        req.owner_id._M_string_length = 0;
        req.owner_id.field_2._M_local_buf[0] = '\0';
        req.resource_owner_account._M_string_length = 0;
        req.resource_owner_account.field_2._M_local_buf[0] = '\0';
        req.resource_owner_id._M_string_length = 0;
        req.resource_owner_id.field_2._M_local_buf[0] = '\0';
        req.owner_account._M_string_length = 0;
        req.owner_account.field_2._M_local_buf[0] = '\0';
        req.instance_id._M_dataplus._M_p = (pointer)&req.instance_id.field_2;
        req.instance_id._M_string_length = 0;
        req.instance_id.field_2._M_local_buf[0] = '\0';
        local_278 = (char  [8])&local_268;
        local_270._M_p = (pointer)0x0;
        local_268._M_local_buf[0] = '\0';
        resp_2.instance_id._M_dataplus._M_p = (pointer)&resp_2.instance_id.field_2;
        resp_2.instance_id._M_string_length = 0;
        resp_2.instance_id.field_2._M_allocated_capacity =
             resp_2.instance_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
        req.owner_id._M_dataplus._M_p = (pointer)paVar1;
        req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
        req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
        req.owner_account._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::string<std::allocator<char>>
                  (local_378,"cn-hangzhou",(allocator<char> *)&local_3b8);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_398,"my_appid",(allocator<char> *)&resp);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_358,"my_secret",&local_3b9);
        paVar5 = &req.instance_id.field_2;
        this = (OcsCreateInstanceRequestType *)
               aliyun::Ocs::CreateOcsClient(local_378,local_398,&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string(local_398);
        std::__cxx11::string::~string(local_378);
        if (this == (OcsCreateInstanceRequestType *)0x0) {
          std::__cxx11::string::~string((string *)&resp_2);
          aliyun::OcsDataOperateRequestType::~OcsDataOperateRequestType
                    ((OcsDataOperateRequestType *)&req);
          req.owner_id._M_string_length = 0;
          req.owner_id.field_2._M_local_buf[0] = '\0';
          req.resource_owner_account._M_string_length = 0;
          req.resource_owner_account.field_2._M_local_buf[0] = '\0';
          req.resource_owner_id._M_string_length = 0;
          req.resource_owner_id.field_2._M_local_buf[0] = '\0';
          req.owner_account._M_string_length = 0;
          req.owner_account.field_2._M_local_buf[0] = '\0';
          req.instance_id._M_string_length = 0;
          req.instance_id.field_2._M_local_buf[0] = '\0';
          req.owner_id._M_dataplus._M_p = (pointer)paVar1;
          req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
          req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
          req.owner_account._M_dataplus._M_p = (pointer)paVar4;
          req.instance_id._M_dataplus._M_p = (pointer)paVar5;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&resp_2,"cn-hangzhou",(allocator<char> *)&local_358);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_378,"my_appid",(allocator<char> *)&local_3b8);
          std::__cxx11::string::string<std::allocator<char>>(local_398,"my_secret",&local_3b9);
          this = (OcsCreateInstanceRequestType *)
                 aliyun::Ocs::CreateOcsClient(&resp_2,local_378,local_398);
          std::__cxx11::string::~string(local_398);
          std::__cxx11::string::~string(local_378);
          std::__cxx11::string::~string((string *)&resp_2);
          if (this == (OcsCreateInstanceRequestType *)0x0) {
            aliyun::OcsDeactivateInstanceRequestType::~OcsDeactivateInstanceRequestType
                      ((OcsDeactivateInstanceRequestType *)&req);
            req.owner_id._M_string_length = 0;
            req.owner_id.field_2._M_local_buf[0] = '\0';
            req.resource_owner_account._M_string_length = 0;
            req.resource_owner_account.field_2._M_local_buf[0] = '\0';
            req.resource_owner_id._M_string_length = 0;
            req.resource_owner_id.field_2._M_local_buf[0] = '\0';
            req.owner_account._M_string_length = 0;
            req.owner_account.field_2._M_local_buf[0] = '\0';
            req.instance_id._M_string_length = 0;
            req.instance_id.field_2._M_local_buf[0] = '\0';
            req.owner_id._M_dataplus._M_p = (pointer)paVar1;
            req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
            req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
            req.owner_account._M_dataplus._M_p = (pointer)paVar4;
            req.instance_id._M_dataplus._M_p = (pointer)paVar5;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&resp_2,"cn-hangzhou",(allocator<char> *)&local_358);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_378,"my_appid",(allocator<char> *)&local_3b8);
            std::__cxx11::string::string<std::allocator<char>>(local_398,"my_secret",&local_3b9);
            this = (OcsCreateInstanceRequestType *)
                   aliyun::Ocs::CreateOcsClient(&resp_2,local_378,local_398);
            std::__cxx11::string::~string(local_398);
            std::__cxx11::string::~string(local_378);
            std::__cxx11::string::~string((string *)&resp_2);
            if (this == (OcsCreateInstanceRequestType *)0x0) {
              aliyun::OcsDeleteInstanceRequestType::~OcsDeleteInstanceRequestType
                        ((OcsDeleteInstanceRequestType *)&req);
              req.owner_id._M_string_length = 0;
              req.owner_id.field_2._M_local_buf[0] = '\0';
              req.resource_owner_account._M_string_length = 0;
              req.resource_owner_account.field_2._M_local_buf[0] = '\0';
              req.resource_owner_id._M_string_length = 0;
              req.resource_owner_id.field_2._M_local_buf[0] = '\0';
              req.owner_account._M_string_length = 0;
              req.owner_account.field_2._M_local_buf[0] = '\0';
              req.instance_id._M_string_length = 0;
              req.instance_id.field_2._M_local_buf[0] = '\0';
              resp_2.instance_id._M_dataplus._M_p = (pointer)&resp_2.instance_id.field_2;
              resp_2.instance_id._M_string_length = 0;
              resp_2.instance_id.field_2._M_allocated_capacity =
                   resp_2.instance_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
              req.owner_id._M_dataplus._M_p = (pointer)paVar1;
              req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
              req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
              req.owner_account._M_dataplus._M_p = (pointer)paVar4;
              req.instance_id._M_dataplus._M_p = (pointer)paVar5;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_378,"cn-hangzhou",(allocator<char> *)&local_3b8);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_398,"my_appid",(allocator<char> *)&resp);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_358,"my_secret",&local_3b9);
              this = (OcsCreateInstanceRequestType *)
                     aliyun::Ocs::CreateOcsClient(local_378,local_398,&local_358);
              std::__cxx11::string::~string((string *)&local_358);
              std::__cxx11::string::~string(local_398);
              std::__cxx11::string::~string(local_378);
              if (this == (OcsCreateInstanceRequestType *)0x0) {
                std::__cxx11::string::~string((string *)&resp_2);
                aliyun::OcsDescribeAuthenticIPRequestType::~OcsDescribeAuthenticIPRequestType
                          ((OcsDescribeAuthenticIPRequestType *)&req);
                req.owner_id._M_string_length = 0;
                req.owner_id.field_2._M_local_buf[0] = '\0';
                req.resource_owner_account._M_string_length = 0;
                req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                req.resource_owner_id._M_string_length = 0;
                req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                req.owner_account._M_string_length = 0;
                req.owner_account.field_2._M_local_buf[0] = '\0';
                req.instance_id._M_dataplus._M_p = (pointer)&req.instance_id.field_2;
                req.instance_id._M_string_length = 0;
                req.instance_id.field_2._M_local_buf[0] = '\0';
                local_278 = (char  [8])&local_268;
                local_270._M_p = (pointer)0x0;
                local_268._M_local_buf[0] = '\0';
                local_258 = (char  [8])&local_248;
                local_250._M_p = (pointer)0x0;
                local_248._M_local_buf[0] = '\0';
                local_238 = (char  [8])&local_228;
                local_230 = 0;
                local_228._M_local_buf[0] = '\0';
                local_218._M_p = (pointer)&local_208;
                local_210._M_p = (pointer)0x0;
                local_208._M_local_buf[0] = '\0';
                resp_2.instance_id._M_dataplus._M_p = (pointer)&resp_2.instance_id.field_2;
                resp_2.instance_id._M_string_length = 0;
                resp_2.instance_id.field_2._M_allocated_capacity =
                     resp_2.instance_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                std::__cxx11::string::string<std::allocator<char>>
                          (local_378,"cn-hangzhou",(allocator<char> *)&local_3b8);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_398,"my_appid",(allocator<char> *)&resp);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_358,"my_secret",&local_3b9);
                this = (OcsCreateInstanceRequestType *)
                       aliyun::Ocs::CreateOcsClient(local_378,local_398,&local_358);
                std::__cxx11::string::~string((string *)&local_358);
                std::__cxx11::string::~string(local_398);
                std::__cxx11::string::~string(local_378);
                if (this == (OcsCreateInstanceRequestType *)0x0) {
                  std::__cxx11::string::~string((string *)&resp_2);
                  aliyun::OcsDescribeHistoryMonitorValuesRequestType::
                  ~OcsDescribeHistoryMonitorValuesRequestType
                            ((OcsDescribeHistoryMonitorValuesRequestType *)&req);
                  req.owner_id._M_string_length = 0;
                  req.owner_id.field_2._M_local_buf[0] = '\0';
                  req.resource_owner_account._M_string_length = 0;
                  req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                  req.resource_owner_id._M_string_length = 0;
                  req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                  req.owner_account._M_string_length = 0;
                  req.owner_account.field_2._M_local_buf[0] = '\0';
                  req.instance_id._M_dataplus._M_p = (pointer)&req.instance_id.field_2;
                  req.instance_id._M_string_length = 0;
                  req.instance_id.field_2._M_local_buf[0] = '\0';
                  local_278 = (char  [8])&local_268;
                  local_270._M_p = (pointer)0x0;
                  local_268._M_local_buf[0] = '\0';
                  local_258 = (char  [8])&local_248;
                  local_250._M_p = (pointer)0x0;
                  local_248._M_local_buf[0] = '\0';
                  local_238 = (char  [8])&local_228;
                  local_230 = 0;
                  local_228._M_local_buf[0] = '\0';
                  local_218._M_p = (pointer)&local_208;
                  local_210._M_p = (pointer)0x0;
                  local_208._M_local_buf[0] = '\0';
                  local_1f8 = (char  [8])&local_1e8;
                  local_1f0._M_p = (pointer)0x0;
                  local_1e8._M_local_buf[0] = '\0';
                  local_1d8 = (char  [8])&local_1c8;
                  local_1d0 = 0;
                  local_1c8._M_local_buf[0] = '\0';
                  local_1b8._M_p = (pointer)&local_1a8;
                  local_1b0 = 0;
                  local_1a8._M_local_buf[0] = '\0';
                  resp_2.instance_id._M_dataplus._M_p = (pointer)0x0;
                  resp_2.instance_id._M_string_length = 0;
                  resp_2.instance_id.field_2._M_allocated_capacity = 0;
                  req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                  req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                  req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                  req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_378,"cn-hangzhou",(allocator<char> *)&local_3b8);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_398,"my_appid",(allocator<char> *)&resp);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_358,"my_secret",&local_3b9);
                  paVar5 = &req.instance_id.field_2;
                  this = (OcsCreateInstanceRequestType *)
                         aliyun::Ocs::CreateOcsClient(local_378,local_398,&local_358);
                  std::__cxx11::string::~string((string *)&local_358);
                  std::__cxx11::string::~string(local_398);
                  std::__cxx11::string::~string(local_378);
                  if (this == (OcsCreateInstanceRequestType *)0x0) {
                    std::
                    vector<aliyun::OcsDescribeInstancesOcsInstanceType,_std::allocator<aliyun::OcsDescribeInstancesOcsInstanceType>_>
                    ::~vector((vector<aliyun::OcsDescribeInstancesOcsInstanceType,_std::allocator<aliyun::OcsDescribeInstancesOcsInstanceType>_>
                               *)&resp_2);
                    aliyun::OcsDescribeInstancesRequestType::~OcsDescribeInstancesRequestType
                              ((OcsDescribeInstancesRequestType *)&req);
                    req.owner_id._M_string_length = 0;
                    req.owner_id.field_2._M_local_buf[0] = '\0';
                    req.resource_owner_account._M_string_length = 0;
                    req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                    req.resource_owner_id._M_string_length = 0;
                    req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                    req.owner_account._M_string_length = 0;
                    req.owner_account.field_2._M_local_buf[0] = '\0';
                    _resp = (pointer)0x0;
                    req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                    req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                    req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                    req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&resp_2,"cn-hangzhou",(allocator<char> *)&local_358);
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_378,"my_appid",(allocator<char> *)&local_3b8);
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_398,"my_secret",&local_3b9);
                    this = (OcsCreateInstanceRequestType *)
                           aliyun::Ocs::CreateOcsClient(&resp_2,local_378,local_398);
                    std::__cxx11::string::~string(local_398);
                    std::__cxx11::string::~string(local_378);
                    std::__cxx11::string::~string((string *)&resp_2);
                    if (this == (OcsCreateInstanceRequestType *)0x0) {
                      std::
                      vector<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType,_std::allocator<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType>_>
                      ::~vector((vector<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType,_std::allocator<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType>_>
                                 *)&resp);
                      aliyun::OcsDescribeMonitorItemsRequestType::
                      ~OcsDescribeMonitorItemsRequestType
                                ((OcsDescribeMonitorItemsRequestType *)&req);
                      req.owner_id._M_string_length = 0;
                      req.owner_id.field_2._M_local_buf[0] = '\0';
                      req.resource_owner_account._M_string_length = 0;
                      req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                      req.resource_owner_id._M_string_length = 0;
                      req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                      req.owner_account._M_string_length = 0;
                      req.owner_account.field_2._M_local_buf[0] = '\0';
                      req.instance_id._M_string_length = 0;
                      req.instance_id.field_2._M_local_buf[0] = '\0';
                      local_278 = (char  [8])&local_268;
                      local_270._M_p = (pointer)0x0;
                      local_268._M_local_buf[0] = '\0';
                      resp_2.instance_id.field_2._8_8_ = &resp_2.instance_name._M_string_length;
                      resp_2.instance_id._M_dataplus._M_p = (pointer)0x0;
                      resp_2.instance_id._M_string_length = 0;
                      resp_2.instance_id.field_2._M_allocated_capacity = 0;
                      resp_2.instance_name._M_dataplus._M_p = (pointer)0x0;
                      resp_2.instance_name._M_string_length =
                           resp_2.instance_name._M_string_length & 0xffffffffffffff00;
                      req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                      req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                      req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                      req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                      req.instance_id._M_dataplus._M_p = (pointer)paVar5;
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_378,"cn-hangzhou",(allocator<char> *)&local_3b8);
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_398,"my_appid",(allocator<char> *)&resp);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_358,"my_secret",&local_3b9);
                      this = (OcsCreateInstanceRequestType *)
                             aliyun::Ocs::CreateOcsClient(local_378,local_398,&local_358);
                      std::__cxx11::string::~string((string *)&local_358);
                      std::__cxx11::string::~string(local_398);
                      std::__cxx11::string::~string(local_378);
                      if (this == (OcsCreateInstanceRequestType *)0x0) {
                        aliyun::OcsDescribeMonitorValuesResponseType::
                        ~OcsDescribeMonitorValuesResponseType
                                  ((OcsDescribeMonitorValuesResponseType *)&resp_2);
                        aliyun::OcsDescribeMonitorValuesRequestType::
                        ~OcsDescribeMonitorValuesRequestType
                                  ((OcsDescribeMonitorValuesRequestType *)&req);
                        req.owner_id._M_string_length = 0;
                        req.owner_id.field_2._M_local_buf[0] = '\0';
                        req.resource_owner_account._M_string_length = 0;
                        req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                        req.resource_owner_id._M_string_length = 0;
                        req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                        req.owner_account._M_string_length = 0;
                        req.owner_account.field_2._M_local_buf[0] = '\0';
                        _resp = (pointer)0x0;
                        req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                        req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                        req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                        req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&resp_2,"cn-hangzhou",(allocator<char> *)&local_358);
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_378,"my_appid",(allocator<char> *)&local_3b8);
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_398,"my_secret",&local_3b9);
                        this = (OcsCreateInstanceRequestType *)
                               aliyun::Ocs::CreateOcsClient(&resp_2,local_378,local_398);
                        std::__cxx11::string::~string(local_398);
                        std::__cxx11::string::~string(local_378);
                        std::__cxx11::string::~string((string *)&resp_2);
                        if (this == (OcsCreateInstanceRequestType *)0x0) {
                          std::
                          vector<aliyun::OcsDescribeRegionsOcsRegionType,_std::allocator<aliyun::OcsDescribeRegionsOcsRegionType>_>
                          ::~vector((vector<aliyun::OcsDescribeRegionsOcsRegionType,_std::allocator<aliyun::OcsDescribeRegionsOcsRegionType>_>
                                     *)&resp);
                          aliyun::OcsDescribeRegionsRequestType::~OcsDescribeRegionsRequestType
                                    ((OcsDescribeRegionsRequestType *)&req);
                          req.owner_id._M_string_length = 0;
                          req.owner_id.field_2._M_local_buf[0] = '\0';
                          req.resource_owner_account._M_string_length = 0;
                          req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                          req.resource_owner_id._M_string_length = 0;
                          req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                          req.owner_account._M_string_length = 0;
                          req.owner_account.field_2._M_local_buf[0] = '\0';
                          req.instance_id._M_string_length = 0;
                          req.instance_id.field_2._M_local_buf[0] = '\0';
                          resp_2.instance_id._M_dataplus._M_p = (pointer)&resp_2.instance_id.field_2
                          ;
                          resp_2.instance_id._M_string_length = 0;
                          resp_2.instance_id.field_2._M_allocated_capacity =
                               resp_2.instance_id.field_2._M_allocated_capacity & 0xffffffffffffff00
                          ;
                          req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                          req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                          req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                          req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                          req.instance_id._M_dataplus._M_p = (pointer)paVar5;
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_378,"cn-hangzhou",(allocator<char> *)&local_3b8);
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_398,"my_appid",(allocator<char> *)&resp);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_358,"my_secret",&local_3b9);
                          this = (OcsCreateInstanceRequestType *)
                                 aliyun::Ocs::CreateOcsClient(local_378,local_398,&local_358);
                          std::__cxx11::string::~string((string *)&local_358);
                          std::__cxx11::string::~string(local_398);
                          std::__cxx11::string::~string(local_378);
                          if (this == (OcsCreateInstanceRequestType *)0x0) {
                            std::__cxx11::string::~string((string *)&resp_2);
                            aliyun::OcsDescribeSecurityIpsRequestType::
                            ~OcsDescribeSecurityIpsRequestType
                                      ((OcsDescribeSecurityIpsRequestType *)&req);
                            req.owner_id._M_string_length = 0;
                            req.owner_id.field_2._M_local_buf[0] = '\0';
                            req.resource_owner_account._M_string_length = 0;
                            req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                            req.resource_owner_id._M_string_length = 0;
                            req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                            req.owner_account._M_string_length = 0;
                            req.owner_account.field_2._M_local_buf[0] = '\0';
                            req.instance_id._M_string_length = 0;
                            req.instance_id.field_2._M_local_buf[0] = '\0';
                            _resp = (pointer)0x0;
                            req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                            req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                            req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                            req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                            req.instance_id._M_dataplus._M_p = (pointer)paVar5;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&resp_2,"cn-hangzhou",(allocator<char> *)&local_358
                                      );
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_378,"my_appid",(allocator<char> *)&local_3b8);
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_398,"my_secret",&local_3b9);
                            this = (OcsCreateInstanceRequestType *)
                                   aliyun::Ocs::CreateOcsClient(&resp_2,local_378,local_398);
                            std::__cxx11::string::~string(local_398);
                            std::__cxx11::string::~string(local_378);
                            std::__cxx11::string::~string((string *)&resp_2);
                            if (this == (OcsCreateInstanceRequestType *)0x0) {
                              std::
                              vector<aliyun::OcsDescribeZonesOcsZoneType,_std::allocator<aliyun::OcsDescribeZonesOcsZoneType>_>
                              ::~vector((vector<aliyun::OcsDescribeZonesOcsZoneType,_std::allocator<aliyun::OcsDescribeZonesOcsZoneType>_>
                                         *)&resp);
                              aliyun::OcsDescribeZonesRequestType::~OcsDescribeZonesRequestType
                                        ((OcsDescribeZonesRequestType *)&req);
                              req.owner_id._M_string_length = 0;
                              req.owner_id.field_2._M_local_buf[0] = '\0';
                              req.resource_owner_account._M_string_length = 0;
                              req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                              req.resource_owner_id._M_string_length = 0;
                              req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                              req.owner_account._M_string_length = 0;
                              req.owner_account.field_2._M_local_buf[0] = '\0';
                              req.instance_id._M_string_length = 0;
                              req.instance_id.field_2._M_local_buf[0] = '\0';
                              req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                              req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                              req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                              req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                              req.instance_id._M_dataplus._M_p = (pointer)paVar5;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&resp_2,"cn-hangzhou",
                                         (allocator<char> *)&local_358);
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_378,"my_appid",(allocator<char> *)&local_3b8);
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_398,"my_secret",&local_3b9);
                              this = (OcsCreateInstanceRequestType *)
                                     aliyun::Ocs::CreateOcsClient(&resp_2,local_378,local_398);
                              std::__cxx11::string::~string(local_398);
                              std::__cxx11::string::~string(local_378);
                              std::__cxx11::string::~string((string *)&resp_2);
                              if (this == (OcsCreateInstanceRequestType *)0x0) {
                                aliyun::OcsFlushInstanceRequestType::~OcsFlushInstanceRequestType
                                          ((OcsFlushInstanceRequestType *)&req);
                                req.owner_id._M_string_length = 0;
                                req.owner_id.field_2._M_local_buf[0] = '\0';
                                req.resource_owner_account._M_string_length = 0;
                                req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                                req.resource_owner_id._M_string_length = 0;
                                req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                req.owner_account._M_string_length = 0;
                                req.owner_account.field_2._M_local_buf[0] = '\0';
                                req.instance_id._M_string_length = 0;
                                req.instance_id.field_2._M_local_buf[0] = '\0';
                                local_278 = (char  [8])&local_268;
                                local_270._M_p = (pointer)0x0;
                                local_268._M_local_buf[0] = '\0';
                                local_258 = (char  [8])&local_248;
                                local_250._M_p = (pointer)0x0;
                                local_248._M_local_buf[0] = '\0';
                                req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                                req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                                req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                                req.instance_id._M_dataplus._M_p = (pointer)paVar5;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&resp_2,"cn-hangzhou",
                                           (allocator<char> *)&local_358);
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_378,"my_appid",(allocator<char> *)&local_3b8);
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_398,"my_secret",&local_3b9);
                                this = (OcsCreateInstanceRequestType *)
                                       aliyun::Ocs::CreateOcsClient(&resp_2,local_378,local_398);
                                std::__cxx11::string::~string(local_398);
                                std::__cxx11::string::~string(local_378);
                                std::__cxx11::string::~string((string *)&resp_2);
                                if (this == (OcsCreateInstanceRequestType *)0x0) {
                                  aliyun::OcsModifyInstanceAttributeRequestType::
                                  ~OcsModifyInstanceAttributeRequestType
                                            ((OcsModifyInstanceAttributeRequestType *)&req);
                                  req.owner_id._M_string_length = 0;
                                  req.owner_id.field_2._M_local_buf[0] = '\0';
                                  req.resource_owner_account._M_string_length = 0;
                                  req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                                  req.resource_owner_id._M_string_length = 0;
                                  req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                  req.owner_account._M_string_length = 0;
                                  req.owner_account.field_2._M_local_buf[0] = '\0';
                                  req.instance_id._M_string_length = 0;
                                  req.instance_id.field_2._M_local_buf[0] = '\0';
                                  local_278 = (char  [8])&local_268;
                                  local_270._M_p = (pointer)0x0;
                                  local_268._M_local_buf[0] = '\0';
                                  req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                  req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                                  req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                                  req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                                  req.instance_id._M_dataplus._M_p = (pointer)paVar5;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&resp_2,"cn-hangzhou",
                                             (allocator<char> *)&local_358);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_378,"my_appid",(allocator<char> *)&local_3b8);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_398,"my_secret",&local_3b9);
                                  this = (OcsCreateInstanceRequestType *)
                                         aliyun::Ocs::CreateOcsClient(&resp_2,local_378,local_398);
                                  std::__cxx11::string::~string(local_398);
                                  std::__cxx11::string::~string(local_378);
                                  std::__cxx11::string::~string((string *)&resp_2);
                                  if (this == (OcsCreateInstanceRequestType *)0x0) {
                                    aliyun::OcsModifyInstanceCapacityRequestType::
                                    ~OcsModifyInstanceCapacityRequestType
                                              ((OcsModifyInstanceCapacityRequestType *)&req);
                                    req.owner_id._M_string_length = 0;
                                    req.owner_id.field_2._M_local_buf[0] = '\0';
                                    req.resource_owner_account._M_string_length = 0;
                                    req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                                    req.resource_owner_id._M_string_length = 0;
                                    req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                    req.owner_account._M_string_length = 0;
                                    req.owner_account.field_2._M_local_buf[0] = '\0';
                                    req.instance_id._M_string_length = 0;
                                    req.instance_id.field_2._M_local_buf[0] = '\0';
                                    local_278 = (char  [8])&local_268;
                                    local_270._M_p = (pointer)0x0;
                                    local_268._M_local_buf[0] = '\0';
                                    req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                    req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                                    req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                                    req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                                    req.instance_id._M_dataplus._M_p = (pointer)paVar5;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&resp_2,"cn-hangzhou",
                                               (allocator<char> *)&local_358);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              (local_378,"my_appid",(allocator<char> *)&local_3b8);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              (local_398,"my_secret",&local_3b9);
                                    this = (OcsCreateInstanceRequestType *)
                                           aliyun::Ocs::CreateOcsClient(&resp_2,local_378,local_398)
                                    ;
                                    std::__cxx11::string::~string(local_398);
                                    std::__cxx11::string::~string(local_378);
                                    std::__cxx11::string::~string((string *)&resp_2);
                                    if (this == (OcsCreateInstanceRequestType *)0x0) {
                                      aliyun::OcsModifySecurityIpsRequestType::
                                      ~OcsModifySecurityIpsRequestType
                                                ((OcsModifySecurityIpsRequestType *)&req);
                                      req.owner_id._M_string_length = 0;
                                      req.owner_id.field_2._M_local_buf[0] = '\0';
                                      req.resource_owner_account._M_string_length = 0;
                                      req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                                      req.resource_owner_id._M_string_length = 0;
                                      req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                      req.owner_account._M_string_length = 0;
                                      req.owner_account.field_2._M_local_buf[0] = '\0';
                                      req.instance_id._M_string_length = 0;
                                      req.instance_id.field_2._M_local_buf[0] = '\0';
                                      local_278 = (char  [8])&local_268;
                                      local_270._M_p = (pointer)0x0;
                                      local_268._M_local_buf[0] = '\0';
                                      req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                      req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                                      req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                                      req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                                      req.instance_id._M_dataplus._M_p = (pointer)paVar5;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&resp_2,"cn-hangzhou",
                                                 (allocator<char> *)&local_358);
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_378,"my_appid",(allocator<char> *)&local_3b8)
                                      ;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_398,"my_secret",&local_3b9);
                                      this = (OcsCreateInstanceRequestType *)
                                             aliyun::Ocs::CreateOcsClient
                                                       (&resp_2,local_378,local_398);
                                      std::__cxx11::string::~string(local_398);
                                      std::__cxx11::string::~string(local_378);
                                      std::__cxx11::string::~string((string *)&resp_2);
                                      if (this == (OcsCreateInstanceRequestType *)0x0) {
                                        aliyun::OcsRemoveAuthenticIPRequestType::
                                        ~OcsRemoveAuthenticIPRequestType
                                                  ((OcsRemoveAuthenticIPRequestType *)&req);
                                        req.owner_id._M_string_length = 0;
                                        req.owner_id.field_2._M_local_buf[0] = '\0';
                                        req.resource_owner_account._M_string_length = 0;
                                        req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                                        req.resource_owner_id._M_string_length = 0;
                                        req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                        req.owner_account._M_string_length = 0;
                                        req.owner_account.field_2._M_local_buf[0] = '\0';
                                        req.instance_id._M_string_length = 0;
                                        req.instance_id.field_2._M_local_buf[0] = '\0';
                                        local_278 = (char  [8])&local_268;
                                        local_270._M_p = (pointer)0x0;
                                        local_268._M_local_buf[0] = '\0';
                                        local_258 = (char  [8])&local_248;
                                        local_250._M_p = (pointer)0x0;
                                        local_248._M_local_buf[0] = '\0';
                                        req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                        req.resource_owner_account._M_dataplus._M_p =
                                             (pointer)paVar2;
                                        req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                                        req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                                        req.instance_id._M_dataplus._M_p = (pointer)paVar5;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&resp_2,"cn-hangzhou",
                                                   (allocator<char> *)&local_358);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (local_378,"my_appid",
                                                   (allocator<char> *)&local_3b8);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (local_398,"my_secret",&local_3b9);
                                        this = (OcsCreateInstanceRequestType *)
                                               aliyun::Ocs::CreateOcsClient
                                                         (&resp_2,local_378,local_398);
                                        std::__cxx11::string::~string(local_398);
                                        std::__cxx11::string::~string(local_378);
                                        std::__cxx11::string::~string((string *)&resp_2);
                                        if (this == (OcsCreateInstanceRequestType *)0x0) {
                                          aliyun::OcsReplaceAuthenticIPRequestType::
                                          ~OcsReplaceAuthenticIPRequestType
                                                    ((OcsReplaceAuthenticIPRequestType *)&req);
                                          req.owner_id._M_string_length = 0;
                                          req.owner_id.field_2._M_local_buf[0] = '\0';
                                          req.resource_owner_account._M_string_length = 0;
                                          req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                                          req.resource_owner_id._M_string_length = 0;
                                          req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                          req.owner_account._M_string_length = 0;
                                          req.owner_account.field_2._M_local_buf[0] = '\0';
                                          req.instance_id._M_string_length = 0;
                                          req.instance_id.field_2._M_local_buf[0] = '\0';
                                          local_278 = (char  [8])&local_268;
                                          local_270._M_p = (pointer)0x0;
                                          local_268._M_local_buf[0] = '\0';
                                          req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                          req.resource_owner_account._M_dataplus._M_p =
                                               (pointer)paVar2;
                                          req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                                          req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                                          req.instance_id._M_dataplus._M_p = (pointer)paVar5;
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&resp_2,"cn-hangzhou",
                                                     (allocator<char> *)&local_358);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (local_378,"my_appid",
                                                     (allocator<char> *)&local_3b8);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (local_398,"my_secret",&local_3b9);
                                          this = (OcsCreateInstanceRequestType *)
                                                 aliyun::Ocs::CreateOcsClient
                                                           (&resp_2,local_378,local_398);
                                          std::__cxx11::string::~string(local_398);
                                          std::__cxx11::string::~string(local_378);
                                          std::__cxx11::string::~string((string *)&resp_2);
                                          if (this == (OcsCreateInstanceRequestType *)0x0) {
                                            aliyun::OcsVerifyPasswordRequestType::
                                            ~OcsVerifyPasswordRequestType
                                                      ((OcsVerifyPasswordRequestType *)&req);
                                            return 0;
                                          }
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_358,"127.0.0.1:12234",
                                                     (allocator<char> *)&local_3b8);
                                          aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
                                          std::__cxx11::string::~string((string *)&local_358);
                                          if ((char)(this->resource_owner_account)._M_string_length
                                              == '\x01') {
                                            *(undefined1 *)
                                             ((long)&(this->resource_owner_account)._M_string_length
                                             + 1) = 0;
                                          }
                                          this_00 = (HttpTestListener *)operator_new(0x180);
                                          HttpTestListener::HttpTestListener(this_00,0x2fca);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_3b8,"{  \"Result\": true}",
                                                     &local_3b9);
                                          HttpTestListener::SetResponseBody(this_00,&local_3b8);
                                          std::__cxx11::string::~string((string *)&local_3b8);
                                          HttpTestListener::Start(this_00);
                                          std::__cxx11::string::assign((char *)&req);
                                          std::__cxx11::string::assign
                                                    ((char *)&req.resource_owner_account);
                                          std::__cxx11::string::assign
                                                    ((char *)&req.resource_owner_id);
                                          std::__cxx11::string::assign((char *)&req.owner_account);
                                          std::__cxx11::string::assign((char *)&req.instance_id);
                                          std::__cxx11::string::assign(local_278);
                                          aliyun::Ocs::VerifyPassword
                                                    ((OcsVerifyPasswordRequestType *)this,
                                                     (OcsVerifyPasswordResponseType *)&req,
                                                     (OcsErrorInfo *)&resp);
                                          HttpTestListener::WaitComplete(this_00);
                                        }
                                        else {
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_358,"127.0.0.1:12234",
                                                     (allocator<char> *)&local_3b8);
                                          aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
                                          std::__cxx11::string::~string((string *)&local_358);
                                          if ((char)(this->resource_owner_account)._M_string_length
                                              == '\x01') {
                                            *(undefined1 *)
                                             ((long)&(this->resource_owner_account)._M_string_length
                                             + 1) = 0;
                                          }
                                          this_00 = (HttpTestListener *)operator_new(0x180);
                                          HttpTestListener::HttpTestListener(this_00,0x2fca);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_3b8,"{}",&local_3b9);
                                          HttpTestListener::SetResponseBody(this_00,&local_3b8);
                                          std::__cxx11::string::~string((string *)&local_3b8);
                                          HttpTestListener::Start(this_00);
                                          std::__cxx11::string::assign((char *)&req);
                                          std::__cxx11::string::assign
                                                    ((char *)&req.resource_owner_account);
                                          std::__cxx11::string::assign
                                                    ((char *)&req.resource_owner_id);
                                          std::__cxx11::string::assign((char *)&req.owner_account);
                                          std::__cxx11::string::assign((char *)&req.instance_id);
                                          std::__cxx11::string::assign(local_278);
                                          std::__cxx11::string::assign(local_258);
                                          aliyun::Ocs::ReplaceAuthenticIP
                                                    ((OcsReplaceAuthenticIPRequestType *)this,
                                                     (OcsReplaceAuthenticIPResponseType *)&req,
                                                     (OcsErrorInfo *)&resp);
                                          HttpTestListener::WaitComplete(this_00);
                                        }
                                      }
                                      else {
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_358,"127.0.0.1:12234",
                                                   (allocator<char> *)&local_3b8);
                                        aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
                                        std::__cxx11::string::~string((string *)&local_358);
                                        if ((char)(this->resource_owner_account)._M_string_length ==
                                            '\x01') {
                                          *(undefined1 *)
                                           ((long)&(this->resource_owner_account)._M_string_length +
                                           1) = 0;
                                        }
                                        this_00 = (HttpTestListener *)operator_new(0x180);
                                        HttpTestListener::HttpTestListener(this_00,0x2fca);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_3b8,"{}",&local_3b9);
                                        HttpTestListener::SetResponseBody(this_00,&local_3b8);
                                        std::__cxx11::string::~string((string *)&local_3b8);
                                        HttpTestListener::Start(this_00);
                                        std::__cxx11::string::assign((char *)&req);
                                        std::__cxx11::string::assign
                                                  ((char *)&req.resource_owner_account);
                                        std::__cxx11::string::assign((char *)&req.resource_owner_id)
                                        ;
                                        std::__cxx11::string::assign((char *)&req.owner_account);
                                        std::__cxx11::string::assign((char *)&req.instance_id);
                                        std::__cxx11::string::assign(local_278);
                                        aliyun::Ocs::RemoveAuthenticIP
                                                  ((OcsRemoveAuthenticIPRequestType *)this,
                                                   (OcsRemoveAuthenticIPResponseType *)&req,
                                                   (OcsErrorInfo *)&resp);
                                        HttpTestListener::WaitComplete(this_00);
                                      }
                                    }
                                    else {
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_358,"127.0.0.1:12234",
                                                 (allocator<char> *)&local_3b8);
                                      aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
                                      std::__cxx11::string::~string((string *)&local_358);
                                      if ((char)(this->resource_owner_account)._M_string_length ==
                                          '\x01') {
                                        *(undefined1 *)
                                         ((long)&(this->resource_owner_account)._M_string_length + 1
                                         ) = 0;
                                      }
                                      this_00 = (HttpTestListener *)operator_new(0x180);
                                      HttpTestListener::HttpTestListener(this_00,0x2fca);
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_3b8,"{}",&local_3b9);
                                      HttpTestListener::SetResponseBody(this_00,&local_3b8);
                                      std::__cxx11::string::~string((string *)&local_3b8);
                                      HttpTestListener::Start(this_00);
                                      std::__cxx11::string::assign((char *)&req);
                                      std::__cxx11::string::assign
                                                ((char *)&req.resource_owner_account);
                                      std::__cxx11::string::assign((char *)&req.resource_owner_id);
                                      std::__cxx11::string::assign((char *)&req.owner_account);
                                      std::__cxx11::string::assign((char *)&req.instance_id);
                                      std::__cxx11::string::assign(local_278);
                                      aliyun::Ocs::ModifySecurityIps
                                                ((OcsModifySecurityIpsRequestType *)this,
                                                 (OcsModifySecurityIpsResponseType *)&req,
                                                 (OcsErrorInfo *)&resp);
                                      HttpTestListener::WaitComplete(this_00);
                                    }
                                  }
                                  else {
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_358,"127.0.0.1:12234",
                                               (allocator<char> *)&local_3b8);
                                    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
                                    std::__cxx11::string::~string((string *)&local_358);
                                    if ((char)(this->resource_owner_account)._M_string_length ==
                                        '\x01') {
                                      *(undefined1 *)
                                       ((long)&(this->resource_owner_account)._M_string_length + 1)
                                           = 0;
                                    }
                                    this_00 = (HttpTestListener *)operator_new(0x180);
                                    HttpTestListener::HttpTestListener(this_00,0x2fca);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_3b8,"{}",&local_3b9);
                                    HttpTestListener::SetResponseBody(this_00,&local_3b8);
                                    std::__cxx11::string::~string((string *)&local_3b8);
                                    HttpTestListener::Start(this_00);
                                    std::__cxx11::string::assign((char *)&req);
                                    std::__cxx11::string::assign
                                              ((char *)&req.resource_owner_account);
                                    std::__cxx11::string::assign((char *)&req.resource_owner_id);
                                    std::__cxx11::string::assign((char *)&req.owner_account);
                                    std::__cxx11::string::assign((char *)&req.instance_id);
                                    std::__cxx11::string::assign(local_278);
                                    aliyun::Ocs::ModifyInstanceCapacity
                                              ((OcsModifyInstanceCapacityRequestType *)this,
                                               (OcsModifyInstanceCapacityResponseType *)&req,
                                               (OcsErrorInfo *)&resp);
                                    HttpTestListener::WaitComplete(this_00);
                                  }
                                }
                                else {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_358,"127.0.0.1:12234",
                                             (allocator<char> *)&local_3b8);
                                  aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
                                  std::__cxx11::string::~string((string *)&local_358);
                                  if ((char)(this->resource_owner_account)._M_string_length ==
                                      '\x01') {
                                    *(undefined1 *)
                                     ((long)&(this->resource_owner_account)._M_string_length + 1) =
                                         0;
                                  }
                                  this_00 = (HttpTestListener *)operator_new(0x180);
                                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_3b8,"{}",&local_3b9);
                                  HttpTestListener::SetResponseBody(this_00,&local_3b8);
                                  std::__cxx11::string::~string((string *)&local_3b8);
                                  HttpTestListener::Start(this_00);
                                  std::__cxx11::string::assign((char *)&req);
                                  std::__cxx11::string::assign((char *)&req.resource_owner_account);
                                  std::__cxx11::string::assign((char *)&req.resource_owner_id);
                                  std::__cxx11::string::assign((char *)&req.owner_account);
                                  std::__cxx11::string::assign((char *)&req.instance_id);
                                  std::__cxx11::string::assign(local_278);
                                  std::__cxx11::string::assign(local_258);
                                  aliyun::Ocs::ModifyInstanceAttribute
                                            ((OcsModifyInstanceAttributeRequestType *)this,
                                             (OcsModifyInstanceAttributeResponseType *)&req,
                                             (OcsErrorInfo *)&resp);
                                  HttpTestListener::WaitComplete(this_00);
                                }
                              }
                              else {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_358,"127.0.0.1:12234",
                                           (allocator<char> *)&local_3b8);
                                aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
                                std::__cxx11::string::~string((string *)&local_358);
                                if ((char)(this->resource_owner_account)._M_string_length == '\x01')
                                {
                                  *(undefined1 *)
                                   ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                                }
                                this_00 = (HttpTestListener *)operator_new(0x180);
                                HttpTestListener::HttpTestListener(this_00,0x2fca);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_3b8,"{}",&local_3b9);
                                HttpTestListener::SetResponseBody(this_00,&local_3b8);
                                std::__cxx11::string::~string((string *)&local_3b8);
                                HttpTestListener::Start(this_00);
                                std::__cxx11::string::assign((char *)&req);
                                std::__cxx11::string::assign((char *)&req.resource_owner_account);
                                std::__cxx11::string::assign((char *)&req.resource_owner_id);
                                std::__cxx11::string::assign((char *)&req.owner_account);
                                std::__cxx11::string::assign((char *)&req.instance_id);
                                aliyun::Ocs::FlushInstance
                                          ((OcsFlushInstanceRequestType *)this,
                                           (OcsFlushInstanceResponseType *)&req,
                                           (OcsErrorInfo *)&resp);
                                HttpTestListener::WaitComplete(this_00);
                              }
                            }
                            else {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_358,"127.0.0.1:12234",
                                         (allocator<char> *)&local_3b8);
                              aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
                              std::__cxx11::string::~string((string *)&local_358);
                              if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                                *(undefined1 *)
                                 ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                              }
                              this_00 = (HttpTestListener *)operator_new(0x180);
                              HttpTestListener::HttpTestListener(this_00,0x2fca);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_3b8,
                                         "{  \"Zones\": {    \"OcsZone\": [      {        \"ZoneId\": \"ZoneId\",        \"Name\": \"Name\",        \"Description\": \"Description\"      }    ]  }}"
                                         ,&local_3b9);
                              HttpTestListener::SetResponseBody(this_00,&local_3b8);
                              std::__cxx11::string::~string((string *)&local_3b8);
                              HttpTestListener::Start(this_00);
                              std::__cxx11::string::assign((char *)&req);
                              std::__cxx11::string::assign((char *)&req.resource_owner_account);
                              std::__cxx11::string::assign((char *)&req.resource_owner_id);
                              std::__cxx11::string::assign((char *)&req.owner_account);
                              std::__cxx11::string::assign((char *)&req.instance_id);
                              aliyun::Ocs::DescribeZones
                                        ((OcsDescribeZonesRequestType *)this,
                                         (OcsDescribeZonesResponseType *)&req,(OcsErrorInfo *)&resp)
                              ;
                              HttpTestListener::WaitComplete(this_00);
                            }
                          }
                          else {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_3b8,"127.0.0.1:12234",
                                       (allocator<char> *)&resp);
                            aliyun::Ocs::SetProxyHost((Ocs *)this,&local_3b8);
                            std::__cxx11::string::~string((string *)&local_3b8);
                            if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                              *(undefined1 *)
                               ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                            }
                            this_00 = (HttpTestListener *)operator_new(0x180);
                            HttpTestListener::HttpTestListener(this_00,0x2fca);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&resp,"{  \"SecurityIps\": \"SecurityIps\"}",
                                       &local_3b9);
                            HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                            std::__cxx11::string::~string((string *)&resp);
                            HttpTestListener::Start(this_00);
                            std::__cxx11::string::assign((char *)&req);
                            std::__cxx11::string::assign((char *)&req.resource_owner_account);
                            std::__cxx11::string::assign((char *)&req.resource_owner_id);
                            std::__cxx11::string::assign((char *)&req.owner_account);
                            std::__cxx11::string::assign((char *)&req.instance_id);
                            aliyun::Ocs::DescribeSecurityIps
                                      ((OcsDescribeSecurityIpsRequestType *)this,
                                       (OcsDescribeSecurityIpsResponseType *)&req,
                                       (OcsErrorInfo *)&resp_2);
                            HttpTestListener::WaitComplete(this_00);
                          }
                        }
                        else {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_358,"127.0.0.1:12234",
                                     (allocator<char> *)&local_3b8);
                          aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
                          std::__cxx11::string::~string((string *)&local_358);
                          if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                            *(undefined1 *)
                             ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                          }
                          this_00 = (HttpTestListener *)operator_new(0x180);
                          HttpTestListener::HttpTestListener(this_00,0x2fca);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_3b8,
                                     "{  \"RegionIds\": {    \"OcsRegion\": [      {        \"RegionId\": \"RegionId\",        \"ZoneIds\": \"ZoneIds\",        \"LocalName\": \"LocalName\"      }    ]  }}"
                                     ,&local_3b9);
                          HttpTestListener::SetResponseBody(this_00,&local_3b8);
                          std::__cxx11::string::~string((string *)&local_3b8);
                          HttpTestListener::Start(this_00);
                          std::__cxx11::string::assign((char *)&req);
                          std::__cxx11::string::assign((char *)&req.resource_owner_account);
                          std::__cxx11::string::assign((char *)&req.resource_owner_id);
                          std::__cxx11::string::assign((char *)&req.owner_account);
                          aliyun::Ocs::DescribeRegions
                                    ((OcsDescribeRegionsRequestType *)this,
                                     (OcsDescribeRegionsResponseType *)&req,(OcsErrorInfo *)&resp);
                          HttpTestListener::WaitComplete(this_00);
                        }
                      }
                      else {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_3b8,"127.0.0.1:12234",(allocator<char> *)&resp);
                        aliyun::Ocs::SetProxyHost((Ocs *)this,&local_3b8);
                        std::__cxx11::string::~string((string *)&local_3b8);
                        if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                          *(undefined1 *)
                           ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                        }
                        this_00 = (HttpTestListener *)operator_new(0x180);
                        HttpTestListener::HttpTestListener(this_00,0x2fca);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&resp,
                                   "{  \"InstanceIds\": {    \"OcsInstanceMonitor\": [      {        \"MonitorKeys\": {          \"OcsMonitorKey\": [            {              \"MonitorKey\": \"MonitorKey\",              \"Value\": \"Value\",              \"Unit\": \"Unit\"            }          ]        },        \"InstanceId\": \"InstanceId\"      }    ]  },  \"Date\": \"Date\"}"
                                   ,&local_3b9);
                        HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                        std::__cxx11::string::~string((string *)&resp);
                        HttpTestListener::Start(this_00);
                        std::__cxx11::string::assign((char *)&req);
                        std::__cxx11::string::assign((char *)&req.resource_owner_account);
                        std::__cxx11::string::assign((char *)&req.resource_owner_id);
                        std::__cxx11::string::assign((char *)&req.owner_account);
                        std::__cxx11::string::assign((char *)&req.instance_id);
                        std::__cxx11::string::assign(local_278);
                        aliyun::Ocs::DescribeMonitorValues
                                  ((OcsDescribeMonitorValuesRequestType *)this,
                                   (OcsDescribeMonitorValuesResponseType *)&req,
                                   (OcsErrorInfo *)&resp_2);
                        HttpTestListener::WaitComplete(this_00);
                      }
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_358,"127.0.0.1:12234",
                                 (allocator<char> *)&local_3b8);
                      aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
                      std::__cxx11::string::~string((string *)&local_358);
                      if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                        *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1)
                             = 0;
                      }
                      this_00 = (HttpTestListener *)operator_new(0x180);
                      HttpTestListener::HttpTestListener(this_00,0x2fca);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_3b8,
                                 "{  \"MonitorItems\": {    \"OcsMonitorItem\": [      {        \"MonitorKey\": \"MonitorKey\",        \"Unit\": \"Unit\"      }    ]  }}"
                                 ,&local_3b9);
                      HttpTestListener::SetResponseBody(this_00,&local_3b8);
                      std::__cxx11::string::~string((string *)&local_3b8);
                      HttpTestListener::Start(this_00);
                      std::__cxx11::string::assign((char *)&req);
                      std::__cxx11::string::assign((char *)&req.resource_owner_account);
                      std::__cxx11::string::assign((char *)&req.resource_owner_id);
                      std::__cxx11::string::assign((char *)&req.owner_account);
                      aliyun::Ocs::DescribeMonitorItems
                                ((OcsDescribeMonitorItemsRequestType *)this,
                                 (OcsDescribeMonitorItemsResponseType *)&req,(OcsErrorInfo *)&resp);
                      HttpTestListener::WaitComplete(this_00);
                    }
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3b8,"127.0.0.1:12234",(allocator<char> *)&resp);
                    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_3b8);
                    std::__cxx11::string::~string((string *)&local_3b8);
                    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) =
                           0;
                    }
                    this_00 = (HttpTestListener *)operator_new(0x180);
                    HttpTestListener::HttpTestListener(this_00,0x2fca);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&resp,
                               "{  \"Instances\": {    \"OcsInstance\": [      {        \"InstanceId\": \"InstanceId\",        \"InstanceName\": \"InstanceName\",        \"ConnectionDomain\": \"ConnectionDomain\",        \"Port\": 0,        \"UserName\": \"UserName\",        \"InstanceStatus\": \"InstanceStatus\",        \"Capacity\": 0,        \"QPS\": 0,        \"Bandwidth\": 0,        \"Connections\": 0,        \"RegionId\": \"RegionId\",        \"ZoneId\": \"ZoneId\",        \"NetworkType\": \"NetworkType\",        \"VpcId\": \"VpcId\",        \"VSwitchId\": \"VSwitchId\",        \"PrivateIpAddress\": \"PrivateIpAddress\",        \"CreationTime\": \"CreationTime\"      }    ]  },  \"TotalCount\": 0,  \"PageNumber\": 0,  \"PageSize\": 0}"
                               ,&local_3b9);
                    HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                    std::__cxx11::string::~string((string *)&resp);
                    HttpTestListener::Start(this_00);
                    std::__cxx11::string::assign((char *)&req);
                    std::__cxx11::string::assign((char *)&req.resource_owner_account);
                    std::__cxx11::string::assign((char *)&req.resource_owner_id);
                    std::__cxx11::string::assign((char *)&req.owner_account);
                    std::__cxx11::string::assign((char *)&req.instance_id);
                    std::__cxx11::string::assign(local_278);
                    std::__cxx11::string::assign(local_258);
                    std::__cxx11::string::assign(local_238);
                    std::__cxx11::string::assign((char *)&local_218);
                    std::__cxx11::string::assign(local_1f8);
                    std::__cxx11::string::assign(local_1d8);
                    std::__cxx11::string::assign((char *)&local_1b8);
                    aliyun::Ocs::DescribeInstances
                              ((OcsDescribeInstancesRequestType *)this,
                               (OcsDescribeInstancesResponseType *)&req,(OcsErrorInfo *)&resp_2);
                    HttpTestListener::WaitComplete(this_00);
                  }
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3b8,"127.0.0.1:12234",(allocator<char> *)&resp);
                  aliyun::Ocs::SetProxyHost((Ocs *)this,&local_3b8);
                  std::__cxx11::string::~string((string *)&local_3b8);
                  if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp,"{  \"MonitorHistory\": \"MonitorHistory\"}",&local_3b9
                            );
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                  std::__cxx11::string::~string((string *)&resp);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  std::__cxx11::string::assign((char *)&req.resource_owner_account);
                  std::__cxx11::string::assign((char *)&req.resource_owner_id);
                  std::__cxx11::string::assign((char *)&req.owner_account);
                  std::__cxx11::string::assign((char *)&req.instance_id);
                  std::__cxx11::string::assign(local_278);
                  std::__cxx11::string::assign(local_258);
                  std::__cxx11::string::assign(local_238);
                  std::__cxx11::string::assign((char *)&local_218);
                  aliyun::Ocs::DescribeHistoryMonitorValues
                            ((OcsDescribeHistoryMonitorValuesRequestType *)this,
                             (OcsDescribeHistoryMonitorValuesResponseType *)&req,
                             (OcsErrorInfo *)&resp_2);
                  HttpTestListener::WaitComplete(this_00);
                }
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3b8,"127.0.0.1:12234",(allocator<char> *)&resp);
                aliyun::Ocs::SetProxyHost((Ocs *)this,&local_3b8);
                std::__cxx11::string::~string((string *)&local_3b8);
                if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                  *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                }
                this_00 = (HttpTestListener *)operator_new(0x180);
                HttpTestListener::HttpTestListener(this_00,0x2fca);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&resp,"{  \"AuthenticIPs\": \"AuthenticIPs\"}",&local_3b9);
                HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                std::__cxx11::string::~string((string *)&resp);
                HttpTestListener::Start(this_00);
                std::__cxx11::string::assign((char *)&req);
                std::__cxx11::string::assign((char *)&req.resource_owner_account);
                std::__cxx11::string::assign((char *)&req.resource_owner_id);
                std::__cxx11::string::assign((char *)&req.owner_account);
                std::__cxx11::string::assign((char *)&req.instance_id);
                aliyun::Ocs::DescribeAuthenticIP
                          ((OcsDescribeAuthenticIPRequestType *)this,
                           (OcsDescribeAuthenticIPResponseType *)&req,(OcsErrorInfo *)&resp_2);
                HttpTestListener::WaitComplete(this_00);
              }
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_358,"127.0.0.1:12234",(allocator<char> *)&local_3b8);
              aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
              std::__cxx11::string::~string((string *)&local_358);
              if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
              }
              this_00 = (HttpTestListener *)operator_new(0x180);
              HttpTestListener::HttpTestListener(this_00,0x2fca);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3b8,"{}",&local_3b9);
              HttpTestListener::SetResponseBody(this_00,&local_3b8);
              std::__cxx11::string::~string((string *)&local_3b8);
              HttpTestListener::Start(this_00);
              std::__cxx11::string::assign((char *)&req);
              std::__cxx11::string::assign((char *)&req.resource_owner_account);
              std::__cxx11::string::assign((char *)&req.resource_owner_id);
              std::__cxx11::string::assign((char *)&req.owner_account);
              std::__cxx11::string::assign((char *)&req.instance_id);
              aliyun::Ocs::DeleteInstance
                        ((OcsDeleteInstanceRequestType *)this,(OcsDeleteInstanceResponseType *)&req,
                         (OcsErrorInfo *)&resp);
              HttpTestListener::WaitComplete(this_00);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_358,"127.0.0.1:12234",(allocator<char> *)&local_3b8);
            aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
            std::__cxx11::string::~string((string *)&local_358);
            if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
              *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
            }
            this_00 = (HttpTestListener *)operator_new(0x180);
            HttpTestListener::HttpTestListener(this_00,0x2fca);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"{}",&local_3b9)
            ;
            HttpTestListener::SetResponseBody(this_00,&local_3b8);
            std::__cxx11::string::~string((string *)&local_3b8);
            HttpTestListener::Start(this_00);
            std::__cxx11::string::assign((char *)&req);
            std::__cxx11::string::assign((char *)&req.resource_owner_account);
            std::__cxx11::string::assign((char *)&req.resource_owner_id);
            std::__cxx11::string::assign((char *)&req.owner_account);
            std::__cxx11::string::assign((char *)&req.instance_id);
            aliyun::Ocs::DeactivateInstance
                      ((OcsDeactivateInstanceRequestType *)this,
                       (OcsDeactivateInstanceResponseType *)&req,(OcsErrorInfo *)&resp);
            HttpTestListener::WaitComplete(this_00);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b8,"127.0.0.1:12234",(allocator<char> *)&resp);
          aliyun::Ocs::SetProxyHost((Ocs *)this,&local_3b8);
          std::__cxx11::string::~string((string *)&local_3b8);
          if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
            *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
          }
          this_00 = (HttpTestListener *)operator_new(0x180);
          HttpTestListener::HttpTestListener(this_00,0x2fca);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&resp,"{  \"CommandResult\": \"CommandResult\"}",&local_3b9);
          HttpTestListener::SetResponseBody(this_00,(string *)&resp);
          std::__cxx11::string::~string((string *)&resp);
          HttpTestListener::Start(this_00);
          std::__cxx11::string::assign((char *)&req);
          std::__cxx11::string::assign((char *)&req.resource_owner_account);
          std::__cxx11::string::assign((char *)&req.resource_owner_id);
          std::__cxx11::string::assign((char *)&req.owner_account);
          std::__cxx11::string::assign((char *)&req.instance_id);
          std::__cxx11::string::assign(local_278);
          aliyun::Ocs::DataOperate
                    ((OcsDataOperateRequestType *)this,(OcsDataOperateResponseType *)&req,
                     (OcsErrorInfo *)&resp_2);
          HttpTestListener::WaitComplete(this_00);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b8,"127.0.0.1:12234",(allocator<char> *)&resp);
        aliyun::Ocs::SetProxyHost((Ocs *)this,&local_3b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
          *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
        }
        this_00 = (HttpTestListener *)operator_new(0x180);
        HttpTestListener::HttpTestListener(this_00,0x2fca);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resp,
                   "{  \"InstanceId\": \"InstanceId\",  \"InstanceName\": \"InstanceName\",  \"ConnectionDomain\": \"ConnectionDomain\",  \"Port\": 0,  \"UserName\": \"UserName\",  \"InstanceStatus\": \"InstanceStatus\",  \"RegionId\": \"RegionId\",  \"ZoneId\": \"ZoneId\",  \"Capacity\": 0,  \"QPS\": 0,  \"Bandwidth\": 0,  \"Connections\": 0,  \"NetworkType\": \"NetworkType\",  \"PrivateIpAddress\": \"PrivateIpAddress\"}"
                   ,&local_3b9);
        HttpTestListener::SetResponseBody(this_00,(string *)&resp);
        std::__cxx11::string::~string((string *)&resp);
        HttpTestListener::Start(this_00);
        std::__cxx11::string::assign((char *)&req);
        std::__cxx11::string::assign((char *)&req.resource_owner_account);
        std::__cxx11::string::assign((char *)&req.resource_owner_id);
        std::__cxx11::string::assign((char *)&req.owner_account);
        std::__cxx11::string::assign((char *)&req.instance_id);
        std::__cxx11::string::assign(local_278);
        std::__cxx11::string::assign(local_258);
        std::__cxx11::string::assign(local_238);
        std::__cxx11::string::assign((char *)&local_218);
        std::__cxx11::string::assign(local_1f8);
        std::__cxx11::string::assign(local_1d8);
        std::__cxx11::string::assign((char *)&local_1b8);
        std::__cxx11::string::assign((char *)&local_198);
        aliyun::Ocs::CreateInstance
                  (this,(OcsCreateInstanceResponseType *)&req,(OcsErrorInfo *)&resp_2);
        HttpTestListener::WaitComplete(this_00);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,"127.0.0.1:12234",(allocator<char> *)&local_3b8);
      aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
        *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
      }
      this_00 = (HttpTestListener *)operator_new(0x180);
      HttpTestListener::HttpTestListener(this_00,0x2fca);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"{}",&local_3b9);
      HttpTestListener::SetResponseBody(this_00,&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      HttpTestListener::Start(this_00);
      std::__cxx11::string::assign((char *)&req);
      std::__cxx11::string::assign((char *)&req.resource_owner_account);
      std::__cxx11::string::assign((char *)&req.resource_owner_id);
      std::__cxx11::string::assign((char *)&req.owner_account);
      std::__cxx11::string::assign((char *)&req.instance_id);
      std::__cxx11::string::assign(local_278);
      aliyun::Ocs::AddAuthenticIP
                ((OcsAddAuthenticIPRequestType *)this,(OcsAddAuthenticIPResponseType *)&req,
                 (OcsErrorInfo *)&resp);
      HttpTestListener::WaitComplete(this_00);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"127.0.0.1:12234",(allocator<char> *)&local_3b8);
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    this_00 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(this_00,0x2fca);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"{}",&local_3b9);
    HttpTestListener::SetResponseBody(this_00,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    HttpTestListener::Start(this_00);
    std::__cxx11::string::assign((char *)&req);
    std::__cxx11::string::assign((char *)&req.resource_owner_account);
    std::__cxx11::string::assign((char *)&req.resource_owner_id);
    std::__cxx11::string::assign((char *)&req.owner_account);
    std::__cxx11::string::assign((char *)&req.instance_id);
    aliyun::Ocs::ActivateInstance
              ((OcsActivateInstanceRequestType *)this,(OcsActivateInstanceResponseType *)&req,
               (OcsErrorInfo *)&resp);
    HttpTestListener::WaitComplete(this_00);
  }
  HttpTestListener::~HttpTestListener(this_00);
  operator_delete(this_00,0x180);
  aliyun::Ocs::~Ocs((Ocs *)this);
  operator_delete(this,0x38);
  aliyun::OcsCreateInstanceResponseType::~OcsCreateInstanceResponseType(&resp_2);
  aliyun::OcsCreateInstanceRequestType::~OcsCreateInstanceRequestType
            ((OcsCreateInstanceRequestType *)&req);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_activate_instance();
  test_add_authentic_ip();
  test_create_instance();
  test_data_operate();
  test_deactivate_instance();
  test_delete_instance();
  test_describe_authentic_ip();
  test_describe_history_monitor_values();
  test_describe_instances();
  test_describe_monitor_items();
  test_describe_monitor_values();
  test_describe_regions();
  test_describe_security_ips();
  test_describe_zones();
  test_flush_instance();
  test_modify_instance_attribute();
  test_modify_instance_capacity();
  test_modify_security_ips();
  test_remove_authentic_ip();
  test_replace_authentic_ip();
  test_verify_password();
}